

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O2

pair<int_*,_bool>
HighsHashTree<int,_int>::insert_into_leaf<1>
          (NodePtr *insertNode,InnerLeaf<1> *leaf,uint64_t hash,int hashPos,
          HighsHashTableEntry<int,_int> *entry)

{
  InnerLeaf<2> *this;
  pair<int_*,_bool> pVar1;
  
  if (leaf->size != 6) {
    pVar1 = InnerLeaf<1>::insert_entry(leaf,hash,hashPos,entry);
    return pVar1;
  }
  pVar1.first = InnerLeaf<1>::find_entry(leaf,hash,hashPos,&entry->key_);
  if (pVar1.first != (ValueType *)0x0) {
    pVar1._8_8_ = 0;
    return pVar1;
  }
  this = (InnerLeaf<2> *)operator_new(0x178);
  InnerLeaf<2>::InnerLeaf<1>(this,leaf);
  insertNode->ptrAndType = (ulong)this | 3;
  operator_delete(leaf);
  pVar1 = InnerLeaf<2>::insert_entry(this,hash,hashPos,entry);
  return pVar1;
}

Assistant:

static std::pair<ValueType*, bool> insert_into_leaf(
      NodePtr* insertNode, InnerLeaf<SizeClass>* leaf, uint64_t hash,
      int hashPos, HighsHashTableEntry<K, V>& entry) {
    if (leaf->size == InnerLeaf<SizeClass>::capacity()) {
      auto existingEntry = leaf->find_entry(hash, hashPos, entry.key());
      if (existingEntry) return std::make_pair(existingEntry, false);

      InnerLeaf<SizeClass + 1>* newLeaf =
          new InnerLeaf<SizeClass + 1>(std::move(*leaf));
      *insertNode = newLeaf;
      delete leaf;
      return newLeaf->insert_entry(hash, hashPos, entry);
    }

    return leaf->insert_entry(hash, hashPos, entry);
  }